

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
CheckEqualFailure::CheckEqualFailure
          (CheckEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *this_00;
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  SimpleString *actual_00;
  size_t pos;
  SimpleString *pos_00;
  SimpleString printableActual;
  undefined1 local_60 [32];
  SimpleString local_40;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00167848;
  TestFailure::createUserText((TestFailure *)local_60,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::asCharString(expected);
  PrintableStringFromOrNull(local_60);
  SimpleString::asCharString(actual);
  PrintableStringFromOrNull((char *)&local_40);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_60);
  pcVar4 = SimpleString::asCharString(&local_40);
  StringFromFormat(local_60 + 0x10,"expected <%s>\n\tbut was  <%s>",pcVar3,pcVar4);
  SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  pos = 0;
  while( true ) {
    cVar1 = SimpleString::at(actual,pos);
    cVar2 = SimpleString::at(expected,pos);
    if (cVar1 != cVar2) break;
    pos = pos + 1;
  }
  pos_00 = (SimpleString *)0x0;
  while( true ) {
    cVar1 = SimpleString::at(&local_40,(size_t)pos_00);
    actual_00 = pos_00;
    cVar2 = SimpleString::at((SimpleString *)local_60,(size_t)pos_00);
    if (cVar1 != cVar2) break;
    pos_00 = (SimpleString *)((long)&pos_00->buffer_ + 1);
  }
  TestFailure::createDifferenceAtPosString
            ((TestFailure *)(local_60 + 0x10),actual_00,(size_t)&local_40,(size_t)pos_00);
  SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString((SimpleString *)local_60);
  return;
}

Assistant:

CheckEqualFailure::CheckEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected.asCharString());
    SimpleString printableActual = PrintableStringFromOrNull(actual.asCharString());

    message_ += createButWasString(printableExpected, printableActual);

    size_t failStart;
    for (failStart = 0; actual.at(failStart) == expected.at(failStart); failStart++)
        ;
    size_t failStartPrintable;
    for (failStartPrintable = 0; printableActual.at(failStartPrintable) == printableExpected.at(failStartPrintable); failStartPrintable++)
        ;
    message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
}